

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void __thiscall edition_unittest::EnumParseTester::Clear(EnumParseTester *this)

{
  RepeatedField<int> *pRVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_small_0_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x20);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_small_0_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x38);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_small_1_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x50);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_small_1_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x68);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_large_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x80);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_large_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x98);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_arbitrary_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0xb0);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_arbitrary_lowfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 200);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_small_0_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0xe0);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_small_0_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0xf8);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_small_1_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x110);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_small_1_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x128);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_large_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x140);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_large_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x158);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_arbitrary_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x170);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_arbitrary_midfield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x188);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_small_0_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x1a0);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_small_0_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x1b8);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_small_1_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x1d0);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_small_1_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x1e8);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_seq_large_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x200);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_seq_large_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x218);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.repeated_arbitrary_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x230);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  pRVar1 = &(this->field_0)._impl_.packed_arbitrary_hifield_;
  uVar3 = *(ulong *)((long)&this->field_0 + 0x248);
  if ((uVar3 & 4) != 0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  bVar5 = (uVar3 & 4) == 0;
  google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  iVar4 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar5);
  if ((iVar4 != 0) &&
     ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  google::protobuf::RepeatedField<int>::set_size(pRVar1,(uVar3 & 4) == 0,0);
  uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  if ((char)uVar2 != '\0') {
    *(undefined8 *)((long)&this->field_0 + 0x268) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x270) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x25c) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x264) = 0;
    (this->field_0)._impl_.optional_seq_large_lowfield_ = -1;
  }
  if ((uVar2 & 0x1f00) != 0) {
    *(undefined8 *)((long)&this->field_0 + 0x27c) = 0xfffffffffffe1f0d;
    *(undefined8 *)((long)&this->field_0 + 0x284) = 0xfffffffffffe1f0d;
    (this->field_0)._impl_.optional_arbitrary_hifield_ = -0x1e0f3;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void EnumParseTester::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.EnumParseTester)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_seq_small_0_lowfield_.Clear();
  _impl_.packed_seq_small_0_lowfield_.Clear();
  _impl_.repeated_seq_small_1_lowfield_.Clear();
  _impl_.packed_seq_small_1_lowfield_.Clear();
  _impl_.repeated_seq_large_lowfield_.Clear();
  _impl_.packed_seq_large_lowfield_.Clear();
  _impl_.repeated_arbitrary_lowfield_.Clear();
  _impl_.packed_arbitrary_lowfield_.Clear();
  _impl_.repeated_seq_small_0_midfield_.Clear();
  _impl_.packed_seq_small_0_midfield_.Clear();
  _impl_.repeated_seq_small_1_midfield_.Clear();
  _impl_.packed_seq_small_1_midfield_.Clear();
  _impl_.repeated_seq_large_midfield_.Clear();
  _impl_.packed_seq_large_midfield_.Clear();
  _impl_.repeated_arbitrary_midfield_.Clear();
  _impl_.packed_arbitrary_midfield_.Clear();
  _impl_.repeated_seq_small_0_hifield_.Clear();
  _impl_.packed_seq_small_0_hifield_.Clear();
  _impl_.repeated_seq_small_1_hifield_.Clear();
  _impl_.packed_seq_small_1_hifield_.Clear();
  _impl_.repeated_seq_large_hifield_.Clear();
  _impl_.packed_seq_large_hifield_.Clear();
  _impl_.repeated_arbitrary_hifield_.Clear();
  _impl_.packed_arbitrary_hifield_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    ::memset(&_impl_.optional_seq_small_0_lowfield_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_seq_small_1_midfield_) -
        reinterpret_cast<char*>(&_impl_.optional_seq_small_0_lowfield_)) + sizeof(_impl_.optional_seq_small_1_midfield_));
    _impl_.optional_seq_large_lowfield_ = -1;
  }
  if ((cached_has_bits & 0x00001f00u) != 0) {
    _impl_.optional_arbitrary_lowfield_ = -123123;
    _impl_.optional_seq_large_midfield_ = -1;
    _impl_.optional_arbitrary_midfield_ = -123123;
    _impl_.optional_seq_large_hifield_ = -1;
    _impl_.optional_arbitrary_hifield_ = -123123;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}